

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_avx2.c
# Opt level: O2

parasail_profile_t *
parasail_profile_create_stats_avx_256_32(char *s1,int _s1Len,parasail_matrix_t *matrix)

{
  __m256i *palVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  __m256i *palVar5;
  __m256i *palVar6;
  __m256i *palVar7;
  parasail_profile_t *ppVar8;
  long lVar9;
  long lVar10;
  char *pcVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  int *piVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  size_t size;
  uint uVar21;
  __m256i_32_t s;
  __m256i_32_t m;
  __m256i_32_t p;
  longlong local_c0;
  longlong lStack_b8;
  longlong lStack_b0;
  longlong lStack_a8;
  longlong local_a0;
  longlong lStack_98;
  longlong lStack_90;
  longlong lStack_88;
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  
  if (matrix == (parasail_matrix_t *)0x0) {
    pcVar11 = "matrix";
  }
  else {
    if (s1 != (char *)0x0) {
      if (matrix->type != 0) {
        _s1Len = matrix->length;
      }
      uVar2 = matrix->size;
      lVar12 = (long)(int)uVar2;
      uVar4 = (_s1Len + 7) / 8;
      size = (int)uVar4 * lVar12;
      palVar5 = parasail_memalign___m256i(0x20,size);
      if ((((palVar5 == (__m256i *)0x0) ||
           (palVar6 = parasail_memalign___m256i(0x20,size), palVar6 == (__m256i *)0x0)) ||
          (palVar7 = parasail_memalign___m256i(0x20,size), palVar7 == (__m256i *)0x0)) ||
         (ppVar8 = parasail_profile_new(s1,_s1Len,matrix), ppVar8 == (parasail_profile_t *)0x0)) {
        return (parasail_profile_t *)0x0;
      }
      lVar9 = (long)_s1Len;
      uVar14 = 0;
      lVar13 = 0;
      do {
        if (uVar14 == (~((int)uVar2 >> 0x1f) & uVar2)) {
          (ppVar8->profile32).score = palVar5;
          (ppVar8->profile32).matches = palVar6;
          (ppVar8->profile32).similar = palVar7;
          ppVar8->free = parasail_free___m256i;
          return ppVar8;
        }
        lVar13 = (long)(int)lVar13;
        lVar18 = 0;
        for (uVar20 = 0; uVar20 != (~((int)uVar4 >> 0x1f) & uVar4); uVar20 = uVar20 + 1) {
          iVar3 = matrix->type;
          lVar17 = lVar18;
          uVar19 = uVar20;
          for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 1) {
            if (iVar3 == 0) {
              if ((long)uVar19 < lVar9) {
                piVar16 = matrix->matrix + uVar14 * lVar12 + (long)matrix->mapper[(byte)s1[uVar19]];
                goto LAB_0074ae09;
              }
LAB_0074ae0e:
              iVar15 = 0;
            }
            else {
              if (lVar9 <= (long)uVar19) goto LAB_0074ae0e;
              piVar16 = (int *)((long)matrix->matrix +
                               lVar17 + (long)matrix->mapper[(byte)matrix->alphabet[uVar14]] * 4);
LAB_0074ae09:
              iVar15 = *piVar16;
            }
            *(int *)((long)&local_80 + lVar10 * 4) = iVar15;
            uVar21 = 0;
            if ((long)uVar19 < lVar9) {
              uVar21 = (uint)(uVar14 == (uint)matrix->mapper[(byte)s1[uVar19]]);
            }
            *(uint *)((long)&local_a0 + lVar10 * 4) = uVar21;
            *(uint *)((long)&local_c0 + lVar10 * 4) = (uint)(0 < iVar15);
            uVar19 = uVar19 + (long)(int)uVar4;
            lVar17 = lVar17 + size * 4;
          }
          palVar1 = palVar5 + lVar13;
          (*palVar1)[0] = local_80;
          (*palVar1)[1] = lStack_78;
          (*palVar1)[2] = lStack_70;
          (*palVar1)[3] = lStack_68;
          palVar1 = palVar6 + lVar13;
          (*palVar1)[0] = local_a0;
          (*palVar1)[1] = lStack_98;
          (*palVar1)[2] = lStack_90;
          (*palVar1)[3] = lStack_88;
          palVar1 = palVar7 + lVar13;
          (*palVar1)[0] = local_c0;
          (*palVar1)[1] = lStack_b8;
          (*palVar1)[2] = lStack_b0;
          (*palVar1)[3] = lStack_a8;
          lVar13 = lVar13 + 1;
          lVar18 = lVar18 + lVar12 * 4;
        }
        uVar14 = uVar14 + 1;
      } while( true );
    }
    pcVar11 = "s1";
  }
  fprintf(_stderr,"%s: missing %s\n","parasail_profile_create_stats_avx_256_32",pcVar11);
  return (parasail_profile_t *)0x0;
}

Assistant:

parasail_profile_t * parasail_profile_create_stats_avx_256_32(
        const char * const restrict s1, const int _s1Len,
        const parasail_matrix_t *matrix)
{
    int s1Len = 0;
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t segNum = 0;
    int32_t n = 0;
    const int32_t segWidth = 8; /* number of values in vector unit */
    int32_t segLen = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict vProfileM = NULL;
    __m256i* restrict vProfileS = NULL;
    int32_t index = 0;
    parasail_profile_t *profile = NULL;

    PARASAIL_CHECK_NULL(matrix);
    /* s1 is required for both pssm and square */
    PARASAIL_CHECK_NULL(s1);

    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    n = matrix->size; /* number of amino acids in table */
    segLen = (s1Len + segWidth - 1) / segWidth;
    vProfile = parasail_memalign___m256i(32, n * segLen);
    if (!vProfile) return NULL;
    vProfileM = parasail_memalign___m256i(32, n * segLen);
    if (!vProfileM) return NULL;
    vProfileS = parasail_memalign___m256i(32, n * segLen);
    if (!vProfileS) return NULL;
    profile = parasail_profile_new(s1, s1Len, matrix);
    if (!profile) return NULL;

    for (k=0; k<n; ++k) {
        for (i=0; i<segLen; ++i) {
            __m256i_32_t p;
            __m256i_32_t m;
            __m256i_32_t s;
            j = i;
            for (segNum=0; segNum<segWidth; ++segNum) {
                if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
                    p.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*k+matrix->mapper[(unsigned char)s1[j]]];
                }
                else {
                    p.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*j+matrix->mapper[(unsigned char)matrix->alphabet[k]]];
                }
                m.v[segNum] = j >= s1Len ? 0 : (k == matrix->mapper[(unsigned char)s1[j]]);
                s.v[segNum] = p.v[segNum] > 0;
                j += segLen;
            }
            _mm256_store_si256(&vProfile[index], p.m);
            _mm256_store_si256(&vProfileM[index], m.m);
            _mm256_store_si256(&vProfileS[index], s.m);
            ++index;
        }
    }

    profile->profile32.score = vProfile;
    profile->profile32.matches = vProfileM;
    profile->profile32.similar = vProfileS;
    profile->free = &parasail_free___m256i;
    return profile;
}